

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O3

int uv_inet_pton(int af,char *src,void *dst)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  ushort *dst_00;
  bool bVar8;
  uchar tmp [16];
  ulong local_68;
  long local_60;
  ushort *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  if (af == 10) {
    local_48 = 0;
    uStack_40 = 0;
    cVar7 = *src;
    iVar2 = -0x16;
    if (cVar7 != '\0') {
      if (cVar7 == ':') {
        if (src[1] != ':') {
          return -0x16;
        }
        src = src + 1;
        cVar7 = ':';
      }
      local_68 = 0;
      dst_00 = (ushort *)&local_48;
      iVar2 = 0;
      local_60 = 0;
      local_58 = (ushort *)0x0;
      local_50 = src;
      local_38 = (undefined8 *)dst;
      do {
        src = src + 1;
        pvVar3 = memchr("0123456789abcdef",(int)cVar7,0x11);
        if (pvVar3 == (void *)0x0) {
          pvVar3 = memchr("0123456789ABCDEF",(int)cVar7,0x11);
          if (pvVar3 != (void *)0x0) {
            iVar4 = 0x1150e0;
            goto LAB_00108a6d;
          }
          if (cVar7 != ':') {
            if (cVar7 != '.') {
              return -0x16;
            }
            if (0xc < local_60) {
              return -0x16;
            }
            iVar2 = inet_pton4(local_50,(uchar *)dst_00);
            if (iVar2 != 0) {
              return -0x16;
            }
            local_60 = local_60 + 4;
            goto LAB_00108b62;
          }
          local_50 = src;
          if (iVar2 == 0) {
            iVar2 = 0;
            bVar8 = local_58 != (ushort *)0x0;
            local_58 = dst_00;
            if (bVar8) {
              return -0x16;
            }
          }
          else {
            if (*src == '\0') {
              return -0x16;
            }
            if (0xe < local_60) {
              return -0x16;
            }
            local_60 = local_60 + 2;
            *dst_00 = (ushort)local_68 << 8 | (ushort)local_68 >> 8;
            iVar2 = 0;
            local_68 = 0;
          }
        }
        else {
          iVar4 = 0x1150c0;
LAB_00108a6d:
          if (3 < iVar2) {
            return -0x16;
          }
          local_68 = (ulong)(uint)((int)pvVar3 - iVar4 | (int)local_68 << 4);
          iVar2 = iVar2 + 1;
        }
        dst_00 = (ushort *)((long)&local_48 + local_60);
        cVar7 = *src;
      } while (cVar7 != '\0');
      if (iVar2 != 0) {
        if (0xe < local_60) {
          return -0x16;
        }
        *(ushort *)((long)&local_48 + local_60) = (ushort)local_68 << 8 | (ushort)local_68 >> 8;
        local_60 = local_60 + 2;
      }
LAB_00108b62:
      if (local_58 == (ushort *)0x0) {
        if (local_60 != 0x10) {
          return -0x16;
        }
      }
      else {
        if (local_60 == 0x10) {
          return -0x16;
        }
        uVar5 = ((int)local_60 + (int)&local_68 + 0x20) - (int)local_58;
        if (0 < (int)uVar5) {
          lVar1 = (ulong)(uVar5 & 0x7fffffff) - 1;
          lVar6 = 0;
          do {
            *(undefined1 *)((long)&uStack_40 + lVar6 + 7) =
                 *(undefined1 *)((long)local_58 + lVar6 + lVar1);
            *(undefined1 *)((long)local_58 + lVar6 + lVar1) = 0;
            lVar6 = lVar6 + -1;
          } while (1 - (ulong)(uVar5 + 1) != lVar6);
        }
      }
      *local_38 = local_48;
      local_38[1] = uStack_40;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -0x61;
    if (af == 2) {
      iVar2 = inet_pton4(src,(uchar *)dst);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6:
    return (inet_pton6(src, dst));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}